

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

png_fixed_point
png_muldiv_warn(png_const_structrp png_ptr,png_fixed_point a,png_int_32 times,png_int_32 divisor)

{
  double dVar1;
  
  if (divisor != 0) {
    if (times == 0 || a == 0) {
      return 0;
    }
    dVar1 = floor(((double)times * (double)a) / (double)divisor + 0.5);
    if ((dVar1 <= 2147483647.0) && (-2147483648.0 <= dVar1)) {
      return (int)dVar1;
    }
  }
  png_warning(png_ptr,"fixed point overflow ignored");
  return 0;
}

Assistant:

png_fixed_point
png_muldiv_warn(png_const_structrp png_ptr, png_fixed_point a, png_int_32 times,
    png_int_32 divisor)
{
   png_fixed_point result;

   if (png_muldiv(&result, a, times, divisor) != 0)
      return result;

   png_warning(png_ptr, "fixed point overflow ignored");
   return 0;
}